

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDCLoader.cpp
# Opt level: O1

void __thiscall
Assimp::MDCImporter::InternReadFile
          (MDCImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  uchar *puVar1;
  BaseVertex *bvert;
  pointer pcVar2;
  short sVar3;
  uint32_t uVar4;
  uchar *puVar5;
  bool bVar6;
  pointer pbVar7;
  undefined8 uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  undefined4 extraout_var;
  ulong uVar12;
  aiMesh **ppaVar13;
  ulong uVar14;
  aiMesh *paVar15;
  size_t sVar16;
  aiVector3D *__s;
  aiVector3D *__s_00;
  aiVector3D *__s_01;
  ulong *puVar17;
  aiFace *paVar18;
  uint *puVar19;
  Logger *this_00;
  aiNode *paVar20;
  aiNode **ppaVar21;
  aiMaterial **ppaVar22;
  aiMaterial *this_01;
  long *plVar23;
  runtime_error *prVar24;
  size_type *psVar25;
  aiFace *paVar26;
  uint uVar27;
  MDCImporter *pMVar28;
  Frame *pFVar29;
  Surface *pcSurf;
  uint uVar30;
  char *pcVar31;
  long lVar32;
  float fVar33;
  float __x;
  float fVar34;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  aszShaders;
  aiColor3D clr;
  int iMode;
  vector<unsigned_char,_std::allocator<unsigned_char>_> mBuffer2;
  aiString path;
  Surface *local_4f8;
  uint local_4ec;
  char *local_4e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4d8;
  undefined8 local_4bc;
  undefined4 local_4b4;
  MDCImporter *local_4b0;
  uint *local_4a8;
  uint local_49c;
  float local_498;
  undefined4 local_494;
  char *local_490;
  aiVector3D *local_488;
  Frame *local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  ulong local_458;
  ulong local_450;
  ulong local_448;
  aiFace *local_440;
  undefined1 local_438 [1032];
  
  pcVar2 = local_438 + 0x10;
  local_438._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"rb","");
  iVar9 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(pFile->_M_dataplus)._M_p,local_438._0_8_);
  plVar23 = (long *)CONCAT44(extraout_var,iVar9);
  if ((pointer)local_438._0_8_ != pcVar2) {
    operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
  }
  if (plVar23 == (long *)0x0) {
    prVar24 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_478,"Failed to open MDC file ",pFile);
    plVar23 = (long *)std::__cxx11::string::append((char *)&local_478);
    local_438._0_8_ = *plVar23;
    psVar25 = (size_type *)(plVar23 + 2);
    if ((size_type *)local_438._0_8_ == psVar25) {
      local_438._16_8_ = *psVar25;
      local_438._24_8_ = plVar23[3];
      local_438._0_8_ = local_438 + 0x10;
    }
    else {
      local_438._16_8_ = *psVar25;
    }
    local_438._8_8_ = plVar23[1];
    *plVar23 = (long)psVar25;
    plVar23[1] = 0;
    *(undefined1 *)(plVar23 + 2) = 0;
    std::runtime_error::runtime_error(prVar24,(string *)local_438);
    *(undefined ***)prVar24 = &PTR__runtime_error_0082bce0;
    __cxa_throw(prVar24,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar10 = (**(code **)(*plVar23 + 0x30))(plVar23);
  this->fileSize = uVar10;
  if ((uVar10 & 0xfffffff0) < 0x70) {
    prVar24 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_438._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"MDC File is too small.","")
    ;
    std::runtime_error::runtime_error(prVar24,(string *)local_438);
    *(undefined ***)prVar24 = &PTR__runtime_error_0082bce0;
    __cxa_throw(prVar24,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_478,(ulong)uVar10,
             (allocator_type *)local_438);
  (**(code **)(*plVar23 + 0x10))(plVar23,local_478._M_dataplus._M_p,1);
  this->mBuffer = (uchar *)local_478._M_dataplus._M_p;
  this->pcHeader = (Header *)local_478._M_dataplus._M_p;
  ValidateHeader(this);
  local_4d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar5 = this->mBuffer;
  uVar10 = this->pcHeader->ulOffsetBorderFrames;
  uVar14 = (ulong)this->pcHeader->ulOffsetSurfaces;
  uVar11 = this->configFrameID;
  local_4f8 = (Surface *)(puVar5 + uVar14);
  puVar1 = puVar5 + uVar14;
  puVar1[0] = '\0';
  puVar1[1] = '\0';
  puVar1[2] = '\0';
  puVar1[3] = '\0';
  puVar1 = puVar5 + uVar14 + 0x43;
  puVar1[0] = '\0';
  puVar1[1] = '\0';
  puVar1[2] = '\0';
  puVar1[3] = '\0';
  puVar1[4] = '\0';
  puVar1[5] = '\0';
  puVar1[6] = '\0';
  puVar1[7] = '\0';
  puVar1[8] = '\0';
  puVar1[9] = '\0';
  puVar1[10] = '\0';
  puVar1[0xb] = '\0';
  puVar1[0xc] = '\0';
  puVar1[0xd] = '\0';
  puVar1[0xe] = '\0';
  puVar1[0xf] = '\0';
  puVar1 = puVar5 + uVar14 + 0x53;
  puVar1[0] = '\0';
  puVar1[1] = '\0';
  puVar1[2] = '\0';
  puVar1[3] = '\0';
  puVar1[4] = '\0';
  puVar1[5] = '\0';
  puVar1[6] = '\0';
  puVar1[7] = '\0';
  puVar1[8] = '\0';
  puVar1[9] = '\0';
  puVar1[10] = '\0';
  puVar1[0xb] = '\0';
  puVar1[0xc] = '\0';
  puVar1[0xd] = '\0';
  puVar1[0xe] = '\0';
  puVar1[0xf] = '\0';
  puVar1 = puVar5 + uVar14 + 99;
  puVar1[0] = '\0';
  puVar1[1] = '\0';
  puVar1[2] = '\0';
  puVar1[3] = '\0';
  puVar1[4] = '\0';
  puVar1[5] = '\0';
  puVar1[6] = '\0';
  puVar1[7] = '\0';
  puVar1[8] = '\0';
  puVar1[9] = '\0';
  puVar1[10] = '\0';
  puVar1[0xb] = '\0';
  puVar1[0xc] = '\0';
  puVar1[0xd] = '\0';
  puVar1[0xe] = '\0';
  puVar1[0xf] = '\0';
  puVar1 = puVar5 + uVar14 + 0x6c;
  puVar1[0] = '\0';
  puVar1[1] = '\0';
  puVar1[2] = '\0';
  puVar1[3] = '\0';
  puVar1[4] = '\0';
  puVar1[5] = '\0';
  puVar1[6] = '\0';
  puVar1[7] = '\0';
  puVar1[8] = '\0';
  puVar1[9] = '\0';
  puVar1[10] = '\0';
  puVar1[0xb] = '\0';
  puVar1[0xc] = '\0';
  puVar1[0xd] = '\0';
  puVar1[0xe] = '\0';
  puVar1[0xf] = '\0';
  uVar14 = 0;
  local_4b0 = this;
  if (this->pcHeader->ulNumSurfaces != 0) {
    uVar27 = 0;
    pcSurf = local_4f8;
    do {
      ValidateSurfaceHeader(local_4b0,pcSurf);
      if ((pcSurf->ulNumVertices != 0) && (pcSurf->ulNumTriangles != 0)) {
        pScene->mNumMeshes = pScene->mNumMeshes + 1;
      }
      uVar30 = (int)uVar14 + pcSurf->ulNumShaders;
      uVar14 = (ulong)uVar30;
      uVar12 = (ulong)pcSurf->ulOffsetEnd;
      pcVar31 = pcSurf->ucName + (uVar12 - 4);
      pcVar31[0] = '\0';
      pcVar31[1] = '\0';
      pcVar31[2] = '\0';
      pcVar31[3] = '\0';
      pcVar31 = pcSurf->ucName + uVar12 + 0x3f;
      pcVar31[0] = '\0';
      pcVar31[1] = '\0';
      pcVar31[2] = '\0';
      pcVar31[3] = '\0';
      pcVar31[4] = '\0';
      pcVar31[5] = '\0';
      pcVar31[6] = '\0';
      pcVar31[7] = '\0';
      pcVar31[8] = '\0';
      pcVar31[9] = '\0';
      pcVar31[10] = '\0';
      pcVar31[0xb] = '\0';
      pcVar31[0xc] = '\0';
      pcVar31[0xd] = '\0';
      pcVar31[0xe] = '\0';
      pcVar31[0xf] = '\0';
      pcVar31 = pcSurf->ucName + uVar12 + 0x4f;
      pcVar31[0] = '\0';
      pcVar31[1] = '\0';
      pcVar31[2] = '\0';
      pcVar31[3] = '\0';
      pcVar31[4] = '\0';
      pcVar31[5] = '\0';
      pcVar31[6] = '\0';
      pcVar31[7] = '\0';
      pcVar31[8] = '\0';
      pcVar31[9] = '\0';
      pcVar31[10] = '\0';
      pcVar31[0xb] = '\0';
      pcVar31[0xc] = '\0';
      pcVar31[0xd] = '\0';
      pcVar31[0xe] = '\0';
      pcVar31[0xf] = '\0';
      pcVar31 = pcSurf->ucName + uVar12 + 0x5f;
      pcVar31[0] = '\0';
      pcVar31[1] = '\0';
      pcVar31[2] = '\0';
      pcVar31[3] = '\0';
      pcVar31[4] = '\0';
      pcVar31[5] = '\0';
      pcVar31[6] = '\0';
      pcVar31[7] = '\0';
      pcVar31[8] = '\0';
      pcVar31[9] = '\0';
      pcVar31[10] = '\0';
      pcVar31[0xb] = '\0';
      pcVar31[0xc] = '\0';
      pcVar31[0xd] = '\0';
      pcVar31[0xe] = '\0';
      pcVar31[0xf] = '\0';
      pcVar31 = pcSurf->ucName + uVar12 + 0x68;
      pcVar31[0] = '\0';
      pcVar31[1] = '\0';
      pcVar31[2] = '\0';
      pcVar31[3] = '\0';
      pcVar31[4] = '\0';
      pcVar31[5] = '\0';
      pcVar31[6] = '\0';
      pcVar31[7] = '\0';
      pcVar31[8] = '\0';
      pcVar31[9] = '\0';
      pcVar31[10] = '\0';
      pcVar31[0xb] = '\0';
      pcVar31[0xc] = '\0';
      pcVar31[0xd] = '\0';
      pcVar31[0xe] = '\0';
      pcVar31[0xf] = '\0';
      pcSurf = (Surface *)(pcSurf->ucName + (uVar12 - 4));
      uVar27 = uVar27 + 1;
    } while (uVar27 < local_4b0->pcHeader->ulNumSurfaces);
    uVar14 = (ulong)uVar30;
  }
  pMVar28 = local_4b0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(&local_4d8,uVar14);
  ppaVar13 = (aiMesh **)operator_new__((ulong)pScene->mNumMeshes << 3);
  pScene->mMeshes = ppaVar13;
  if (pScene->mNumMeshes != 0) {
    uVar14 = 0;
    do {
      pScene->mMeshes[uVar14] = (aiMesh *)0x0;
      uVar14 = uVar14 + 1;
    } while (uVar14 < pScene->mNumMeshes);
  }
  if (pMVar28->pcHeader->ulNumSurfaces != 0) {
    local_480 = (Frame *)(puVar5 + (ulong)uVar10 + (ulong)uVar11 * 0x38);
    uVar14 = 0xffffffff;
    local_4ec = 0;
    uVar10 = 0;
    do {
      if ((local_4f8->ulNumVertices != 0) && (local_4f8->ulNumTriangles != 0)) {
        local_49c = uVar10;
        paVar15 = (aiMesh *)operator_new(0x520);
        paVar15->mPrimitiveTypes = 0;
        paVar15->mNumVertices = 0;
        paVar15->mNumFaces = 0;
        memset(&paVar15->mVertices,0,0xcc);
        paVar15->mBones = (aiBone **)0x0;
        paVar15->mMaterialIndex = 0;
        (paVar15->mName).length = 0;
        (paVar15->mName).data[0] = '\0';
        memset((paVar15->mName).data + 1,0x1b,0x3ff);
        paVar15->mNumAnimMeshes = 0;
        paVar15->mAnimMeshes = (aiAnimMesh **)0x0;
        paVar15->mMethod = 0;
        (paVar15->mAABB).mMin.x = 0.0;
        (paVar15->mAABB).mMin.y = 0.0;
        (paVar15->mAABB).mMin.z = 0.0;
        (paVar15->mAABB).mMax.x = 0.0;
        (paVar15->mAABB).mMax.y = 0.0;
        (paVar15->mAABB).mMax.z = 0.0;
        paVar15->mTextureCoords[0] = (aiVector3D *)0x0;
        paVar15->mTextureCoords[1] = (aiVector3D *)0x0;
        paVar15->mTextureCoords[2] = (aiVector3D *)0x0;
        paVar15->mTextureCoords[3] = (aiVector3D *)0x0;
        paVar15->mTextureCoords[4] = (aiVector3D *)0x0;
        paVar15->mTextureCoords[5] = (aiVector3D *)0x0;
        paVar15->mTextureCoords[6] = (aiVector3D *)0x0;
        paVar15->mTextureCoords[7] = (aiVector3D *)0x0;
        paVar15->mNumUVComponents[0] = 0;
        paVar15->mNumUVComponents[1] = 0;
        paVar15->mNumUVComponents[2] = 0;
        paVar15->mNumUVComponents[3] = 0;
        paVar15->mNumUVComponents[4] = 0;
        paVar15->mNumUVComponents[5] = 0;
        paVar15->mNumUVComponents[6] = 0;
        paVar15->mNumUVComponents[7] = 0;
        paVar15->mColors[0] = (aiColor4D *)0x0;
        paVar15->mColors[1] = (aiColor4D *)0x0;
        paVar15->mColors[2] = (aiColor4D *)0x0;
        paVar15->mColors[3] = (aiColor4D *)0x0;
        paVar15->mColors[4] = (aiColor4D *)0x0;
        paVar15->mColors[5] = (aiColor4D *)0x0;
        paVar15->mColors[6] = (aiColor4D *)0x0;
        paVar15->mColors[7] = (aiColor4D *)0x0;
        pScene->mMeshes[local_4ec] = paVar15;
        uVar10 = local_4f8->ulNumTriangles;
        paVar15->mNumFaces = uVar10;
        paVar15->mNumVertices = uVar10 * 3;
        sVar16 = strnlen(local_4f8->ucName,0x3f);
        pcVar2 = local_438 + 0x10;
        local_438._0_8_ = pcVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_438,local_4f8->ucName,local_4f8->ucName + sVar16);
        uVar8 = local_438._8_8_;
        if ((ulong)local_438._8_8_ < 0x400) {
          (paVar15->mName).length = (ai_uint32)local_438._8_8_;
          memcpy((paVar15->mName).data,(void *)local_438._0_8_,local_438._8_8_);
          (paVar15->mName).data[uVar8] = '\0';
        }
        if ((pointer)local_438._0_8_ != pcVar2) {
          operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
        }
        if (local_4f8->ulNumShaders == 0) {
          if ((uint)uVar14 == 0xffffffff) {
            uVar14 = (ulong)((long)local_4d8.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_4d8.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 5;
            paVar15->mMaterialIndex = (uint)uVar14;
            local_438._8_8_ = 0;
            local_438._16_8_ = local_438._16_8_ & 0xffffffffffffff00;
            local_438._0_8_ = pcVar2;
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_4d8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_438);
            goto joined_r0x0048307a;
          }
          paVar15->mMaterialIndex = (uint)uVar14;
        }
        else {
          pcVar31 = local_4f8->ucName + ((ulong)local_4f8->ulOffsetShaders - 4);
          paVar15->mMaterialIndex =
               (uint)((ulong)((long)local_4d8.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_4d8.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 5);
          sVar16 = strnlen(pcVar31,0x40);
          local_438._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_438,pcVar31,pcVar31 + sVar16);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_4d8
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_438
                    );
joined_r0x0048307a:
          if ((pointer)local_438._0_8_ != pcVar2) {
            operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
          }
        }
        uVar10 = paVar15->mNumVertices;
        uVar12 = (ulong)uVar10;
        __s = (aiVector3D *)operator_new__(uVar12 * 0xc);
        local_458 = uVar14;
        if (uVar12 != 0) {
          memset(__s,0,((uVar12 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
        }
        paVar15->mVertices = __s;
        __s_00 = (aiVector3D *)operator_new__(uVar12 * 0xc);
        if (uVar10 != 0) {
          memset(__s_00,0,((uVar12 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
        }
        paVar15->mNormals = __s_00;
        uVar14 = (ulong)paVar15->mNumVertices;
        __s_01 = (aiVector3D *)operator_new__(uVar14 * 0xc);
        if (uVar14 != 0) {
          memset(__s_01,0,((uVar14 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
        }
        paVar15->mTextureCoords[0] = __s_01;
        uVar14 = (ulong)paVar15->mNumFaces;
        local_488 = __s_01;
        puVar17 = (ulong *)operator_new__(uVar14 * 0x10 + 8);
        *puVar17 = uVar14;
        paVar26 = (aiFace *)(puVar17 + 1);
        if (uVar14 != 0) {
          paVar18 = paVar26;
          do {
            paVar18->mNumIndices = 0;
            paVar18->mIndices = (uint *)0x0;
            paVar18 = paVar18 + 1;
          } while (paVar18 != paVar26 + uVar14);
        }
        paVar15->mFaces = paVar26;
        uVar4 = local_4f8->ulNumVertices;
        local_4a8 = (uint *)(ulong)local_4f8->ulOffsetTriangles;
        local_490 = (char *)(ulong)local_4f8->ulOffsetTexCoords;
        uVar14 = (ulong)local_4b0->configFrameID;
        sVar3 = *(short *)(local_4f8->ucName +
                          uVar14 * 2 + (ulong)local_4f8->ulOffsetFrameBaseFrames + -4);
        uVar10 = local_4f8->ulOffsetBaseVerts;
        bVar6 = true;
        if (((uVar14 == 0) || (local_4f8->ulNumCompFrames == 0)) ||
           (*(short *)(local_4f8->ucName +
                      uVar14 * 2 + (ulong)local_4f8->ulOffsetFrameCompFrames + -4) < 0)) {
          local_4e8 = (char *)0x0;
        }
        else {
          local_4e8 = local_4f8->ucName +
                      (ulong)((int)*(short *)(local_4f8->ucName +
                                             uVar14 * 2 + (ulong)local_4f8->ulOffsetFrameCompFrames
                                             + -4) * uVar4) * 4 +
                      (ulong)local_4f8->ulOffsetCompVerts + -4;
          bVar6 = false;
        }
        if (local_4f8->ulNumTriangles != 0) {
          local_4a8 = (uint *)((long)local_4a8 + (long)local_4f8);
          local_490 = local_4f8->ucName + (long)(local_490 + -4);
          uVar14 = 0;
          do {
            paVar26->mNumIndices = 3;
            puVar19 = (uint *)operator_new__(0xc);
            local_450 = (ulong)(uint)((int)uVar14 * 3);
            paVar26->mIndices = puVar19;
            lVar32 = 0;
            puVar19 = local_4a8;
            local_448 = uVar14;
            local_440 = paVar26;
            do {
              uVar11 = *puVar19;
              if (local_4f8->ulNumVertices <= uVar11) {
                this_00 = DefaultLogger::get();
                Logger::error(this_00,"MDC vertex index is out of range");
                uVar11 = local_4f8->ulNumVertices - 1;
              }
              pFVar29 = local_480;
              uVar14 = (ulong)uVar11;
              bvert = (BaseVertex *)
                      (local_4f8->ucName +
                      uVar14 * 8 + (ulong)((int)sVar3 * uVar4 * 4) * 8 + (ulong)uVar10 + -4);
              if (bVar6) {
                *(float *)((long)&__s->x + lVar32) = (float)(int)bvert->x * 0.015625;
                *(float *)((long)&__s->y + lVar32) = (float)(int)bvert->y * 0.015625;
                *(float *)((long)&__s->z + lVar32) = (float)(int)bvert->z * 0.015625;
                fVar34 = (float)(bvert->normal >> 8) * 0.024546297;
                __x = (float)(byte)bvert->normal * 0.024546297;
                local_498 = cosf(fVar34);
                fVar33 = sinf(__x);
                *(float *)((long)&__s_00->x + lVar32) = fVar33 * local_498;
                fVar33 = sinf(fVar34);
                fVar34 = sinf(__x);
                *(float *)((long)&__s_00->y + lVar32) = fVar34 * fVar33;
                fVar33 = cosf(__x);
                *(float *)((long)&__s_00->z + lVar32) = fVar33;
                *(undefined4 *)((long)&local_488->x + lVar32) =
                     *(undefined4 *)(local_490 + uVar14 * 8);
                *(float *)((long)&local_488->y + lVar32) =
                     1.0 - *(float *)(local_490 + uVar14 * 8 + 4);
                pFVar29 = local_480;
              }
              else {
                MDC::BuildVertex(local_480,bvert,(CompressedVertex *)(local_4e8 + uVar14 * 4),
                                 (aiVector3D *)((long)&__s->x + lVar32),
                                 (aiVector3D *)((long)&__s_00->x + lVar32));
              }
              *(float *)((long)&__s->x + lVar32) =
                   (pFVar29->localOrigin).x + *(float *)((long)&__s->x + lVar32);
              *(float *)((long)&__s->y + lVar32) =
                   (pFVar29->localOrigin).y + *(float *)((long)&__s->y + lVar32);
              *(float *)((long)&__s->z + lVar32) =
                   (pFVar29->localOrigin).z + *(float *)((long)&__s->z + lVar32);
              puVar19 = puVar19 + 1;
              lVar32 = lVar32 + 0xc;
            } while (lVar32 != 0x24);
            uVar11 = (uint)local_450;
            *local_440->mIndices = uVar11 + 2;
            local_440->mIndices[1] = uVar11 + 1;
            local_440->mIndices[2] = uVar11;
            uVar11 = (int)local_448 + 1;
            uVar14 = (ulong)uVar11;
            local_4a8 = local_4a8 + 3;
            paVar26 = local_440 + 1;
            local_488 = local_488 + 3;
            __s_00 = __s_00 + 3;
            __s = __s + 3;
          } while (uVar11 < local_4f8->ulNumTriangles);
        }
        local_4ec = local_4ec + 1;
        uVar14 = (ulong)local_4f8->ulOffsetEnd;
        pcVar31 = local_4f8->ucName + (uVar14 - 4);
        pcVar31[0] = '\0';
        pcVar31[1] = '\0';
        pcVar31[2] = '\0';
        pcVar31[3] = '\0';
        pcVar31 = local_4f8->ucName + uVar14 + 0x3f;
        pcVar31[0] = '\0';
        pcVar31[1] = '\0';
        pcVar31[2] = '\0';
        pcVar31[3] = '\0';
        pcVar31[4] = '\0';
        pcVar31[5] = '\0';
        pcVar31[6] = '\0';
        pcVar31[7] = '\0';
        pcVar31[8] = '\0';
        pcVar31[9] = '\0';
        pcVar31[10] = '\0';
        pcVar31[0xb] = '\0';
        pcVar31[0xc] = '\0';
        pcVar31[0xd] = '\0';
        pcVar31[0xe] = '\0';
        pcVar31[0xf] = '\0';
        pcVar31 = local_4f8->ucName + uVar14 + 0x4f;
        pcVar31[0] = '\0';
        pcVar31[1] = '\0';
        pcVar31[2] = '\0';
        pcVar31[3] = '\0';
        pcVar31[4] = '\0';
        pcVar31[5] = '\0';
        pcVar31[6] = '\0';
        pcVar31[7] = '\0';
        pcVar31[8] = '\0';
        pcVar31[9] = '\0';
        pcVar31[10] = '\0';
        pcVar31[0xb] = '\0';
        pcVar31[0xc] = '\0';
        pcVar31[0xd] = '\0';
        pcVar31[0xe] = '\0';
        pcVar31[0xf] = '\0';
        pcVar31 = local_4f8->ucName + uVar14 + 0x5f;
        pcVar31[0] = '\0';
        pcVar31[1] = '\0';
        pcVar31[2] = '\0';
        pcVar31[3] = '\0';
        pcVar31[4] = '\0';
        pcVar31[5] = '\0';
        pcVar31[6] = '\0';
        pcVar31[7] = '\0';
        pcVar31[8] = '\0';
        pcVar31[9] = '\0';
        pcVar31[10] = '\0';
        pcVar31[0xb] = '\0';
        pcVar31[0xc] = '\0';
        pcVar31[0xd] = '\0';
        pcVar31[0xe] = '\0';
        pcVar31[0xf] = '\0';
        pcVar31 = local_4f8->ucName + uVar14 + 0x68;
        pcVar31[0] = '\0';
        pcVar31[1] = '\0';
        pcVar31[2] = '\0';
        pcVar31[3] = '\0';
        pcVar31[4] = '\0';
        pcVar31[5] = '\0';
        pcVar31[6] = '\0';
        pcVar31[7] = '\0';
        pcVar31[8] = '\0';
        pcVar31[9] = '\0';
        pcVar31[10] = '\0';
        pcVar31[0xb] = '\0';
        pcVar31[0xc] = '\0';
        pcVar31[0xd] = '\0';
        pcVar31[0xe] = '\0';
        pcVar31[0xf] = '\0';
        local_4f8 = (Surface *)(local_4f8->ucName + (uVar14 - 4));
        pMVar28 = local_4b0;
        uVar14 = local_458;
        uVar10 = local_49c;
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 < pMVar28->pcHeader->ulNumSurfaces);
  }
  if (pScene->mNumMeshes == 1) {
    paVar20 = (aiNode *)operator_new(0x478);
    aiNode::aiNode(paVar20);
    pScene->mRootNode = paVar20;
    paVar15 = *pScene->mMeshes;
    if (paVar15 != (aiMesh *)0x0) {
      if (paVar20 != (aiNode *)&paVar15->mName) {
        uVar10 = (paVar15->mName).length;
        (paVar20->mName).length = uVar10;
        memcpy((paVar20->mName).data,(paVar15->mName).data,(ulong)uVar10);
        (paVar20->mName).data[uVar10] = '\0';
      }
      paVar20->mNumMeshes = 1;
      puVar19 = (uint *)operator_new__(4);
      paVar20->mMeshes = puVar19;
      *puVar19 = 0;
    }
  }
  else {
    if (pScene->mNumMeshes == 0) {
      prVar24 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_438._0_8_ = local_438 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_438,"Invalid MDC file: File contains no valid mesh","");
      std::runtime_error::runtime_error(prVar24,(string *)local_438);
      *(undefined ***)prVar24 = &PTR__runtime_error_0082bce0;
      __cxa_throw(prVar24,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    paVar20 = (aiNode *)operator_new(0x478);
    aiNode::aiNode(paVar20);
    pScene->mRootNode = paVar20;
    uVar10 = pScene->mNumMeshes;
    paVar20->mNumChildren = uVar10;
    ppaVar21 = (aiNode **)operator_new__((ulong)uVar10 << 3);
    paVar20->mChildren = ppaVar21;
    (paVar20->mName).length = 6;
    builtin_strncpy((paVar20->mName).data,"<root>",7);
    if (pScene->mNumMeshes != 0) {
      uVar14 = 0;
      do {
        paVar20 = (aiNode *)operator_new(0x478);
        aiNode::aiNode(paVar20);
        pScene->mRootNode->mChildren[uVar14] = paVar20;
        paVar20->mParent = pScene->mRootNode;
        paVar15 = pScene->mMeshes[uVar14];
        if (paVar20 != (aiNode *)&paVar15->mName) {
          uVar10 = (paVar15->mName).length;
          (paVar20->mName).length = uVar10;
          memcpy((paVar20->mName).data,(paVar15->mName).data,(ulong)uVar10);
          (paVar20->mName).data[uVar10] = '\0';
        }
        paVar20->mNumMeshes = 1;
        puVar19 = (uint *)operator_new__(4);
        paVar20->mMeshes = puVar19;
        *puVar19 = (uint)uVar14;
        uVar14 = uVar14 + 1;
      } while (uVar14 < pScene->mNumMeshes);
    }
  }
  pScene->mNumMaterials =
       (uint)((ulong)((long)local_4d8.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_4d8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 5);
  ppaVar22 = (aiMaterial **)
             operator_new__((ulong)((long)local_4d8.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_4d8.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 2 &
                            0x7fffffff8);
  pScene->mMaterials = ppaVar22;
  if (pScene->mNumMaterials != 0) {
    lVar32 = 8;
    uVar14 = 0;
    do {
      this_01 = (aiMaterial *)operator_new(0x10);
      aiMaterial::aiMaterial(this_01);
      pbVar7 = local_4d8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pScene->mMaterials[uVar14] = this_01;
      local_494 = 2;
      aiMaterial::AddBinaryProperty(this_01,&local_494,4,"$mat.shadingm",0,0,aiPTI_Integer);
      local_4bc = 0x3d4ccccd3d4ccccd;
      local_4b4 = 0x3d4ccccd;
      aiMaterial::AddBinaryProperty(this_01,&local_4bc,0xc,"$clr.ambient",0,0,aiPTI_Float);
      local_4b4 = *(undefined4 *)
                   (&DAT_006e5c58 +
                   (ulong)(*(long *)((long)&(pbVar7->_M_dataplus)._M_p + lVar32) == 0) * 4);
      local_4bc = CONCAT44(local_4b4,local_4b4);
      aiMaterial::AddBinaryProperty(this_01,&local_4bc,0xc,"$clr.diffuse",0,0,aiPTI_Float);
      aiMaterial::AddBinaryProperty(this_01,&local_4bc,0xc,"$clr.specular",0,0,aiPTI_Float);
      if (*(long *)((long)&(pbVar7->_M_dataplus)._M_p + lVar32) != 0) {
        local_438._0_8_ = local_438._0_8_ & 0xffffff0000000000;
        memset(local_438 + 5,0x1b,0x3ff);
        uVar12 = *(ulong *)((long)&(pbVar7->_M_dataplus)._M_p + lVar32);
        if (uVar12 < 0x400) {
          local_438._0_4_ = (int)uVar12;
          memcpy(local_438 + 4,*(void **)((long)pbVar7 + lVar32 + -8),uVar12);
          local_438[uVar12 + 4] = 0;
        }
        aiMaterial::AddProperty(this_01,(aiString *)local_438,"$tex.file",1,0);
      }
      uVar14 = uVar14 + 1;
      lVar32 = lVar32 + 0x20;
    } while (uVar14 < pScene->mNumMaterials);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_4d8);
  if ((Header *)local_478._M_dataplus._M_p != (Header *)0x0) {
    operator_delete(local_478._M_dataplus._M_p,
                    local_478.field_2._M_allocated_capacity - (long)local_478._M_dataplus._M_p);
  }
  (**(code **)(*plVar23 + 8))();
  return;
}

Assistant:

void MDCImporter::InternReadFile(
    const std::string& pFile, aiScene* pScene, IOSystem* pIOHandler)
{
    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile));

    // Check whether we can read from the file
    if( file.get() == NULL)
        throw DeadlyImportError( "Failed to open MDC file " + pFile + ".");

    // check whether the mdc file is large enough to contain the file header
    fileSize = (unsigned int)file->FileSize();
    if( fileSize < sizeof(MDC::Header))
        throw DeadlyImportError( "MDC File is too small.");

    std::vector<unsigned char> mBuffer2(fileSize);
    file->Read( &mBuffer2[0], 1, fileSize);
    mBuffer = &mBuffer2[0];

    // validate the file header
    this->pcHeader = (BE_NCONST MDC::Header*)this->mBuffer;
    this->ValidateHeader();

    std::vector<std::string> aszShaders;

    // get a pointer to the frame we want to read
    BE_NCONST MDC::Frame* pcFrame = (BE_NCONST MDC::Frame*)(this->mBuffer+
        this->pcHeader->ulOffsetBorderFrames);

    // no need to swap the other members, we won't need them
    pcFrame += configFrameID;
    AI_SWAP4( pcFrame->localOrigin[0] );
    AI_SWAP4( pcFrame->localOrigin[1] );
    AI_SWAP4( pcFrame->localOrigin[2] );

    // get the number of valid surfaces
    BE_NCONST MDC::Surface* pcSurface, *pcSurface2;
    pcSurface = pcSurface2 = new (mBuffer + pcHeader->ulOffsetSurfaces) MDC::Surface;
    unsigned int iNumShaders = 0;
    for (unsigned int i = 0; i < pcHeader->ulNumSurfaces;++i)
    {
        // validate the surface header
        this->ValidateSurfaceHeader(pcSurface2);

        if (pcSurface2->ulNumVertices && pcSurface2->ulNumTriangles)++pScene->mNumMeshes;
        iNumShaders += pcSurface2->ulNumShaders;
        pcSurface2 = new ((int8_t*)pcSurface2 + pcSurface2->ulOffsetEnd) MDC::Surface;
    }
    aszShaders.reserve(iNumShaders);
    pScene->mMeshes = new aiMesh*[pScene->mNumMeshes];

    // necessary that we don't crash if an exception occurs
    for (unsigned int i = 0; i < pScene->mNumMeshes;++i)
        pScene->mMeshes[i] = NULL;

    // now read all surfaces
    unsigned int iDefaultMatIndex = UINT_MAX;
    for (unsigned int i = 0, iNum = 0; i < pcHeader->ulNumSurfaces;++i)
    {
        if (!pcSurface->ulNumVertices || !pcSurface->ulNumTriangles)continue;
        aiMesh* pcMesh = pScene->mMeshes[iNum++] = new aiMesh();

        pcMesh->mNumFaces = pcSurface->ulNumTriangles;
        pcMesh->mNumVertices = pcMesh->mNumFaces * 3;

        // store the name of the surface for use as node name.
        pcMesh->mName.Set(std::string(pcSurface->ucName
                                    , strnlen(pcSurface->ucName, AI_MDC_MAXQPATH - 1)));

        // go to the first shader in the file. ignore the others.
        if (pcSurface->ulNumShaders)
        {
            const MDC::Shader* pcShader = (const MDC::Shader*)((int8_t*)pcSurface + pcSurface->ulOffsetShaders);
            pcMesh->mMaterialIndex = (unsigned int)aszShaders.size();

            // create a new shader
            aszShaders.push_back(std::string( pcShader->ucName, 
                ::strnlen(pcShader->ucName, sizeof(pcShader->ucName)) ));
        }
        // need to create a default material
        else if (UINT_MAX == iDefaultMatIndex)
        {
            pcMesh->mMaterialIndex = iDefaultMatIndex = (unsigned int)aszShaders.size();
            aszShaders.push_back(std::string());
        }
        // otherwise assign a reference to the default material
        else pcMesh->mMaterialIndex = iDefaultMatIndex;

        // allocate output storage for the mesh
        aiVector3D* pcVertCur   = pcMesh->mVertices         = new aiVector3D[pcMesh->mNumVertices];
        aiVector3D* pcNorCur    = pcMesh->mNormals          = new aiVector3D[pcMesh->mNumVertices];
        aiVector3D* pcUVCur     = pcMesh->mTextureCoords[0] = new aiVector3D[pcMesh->mNumVertices];
        aiFace* pcFaceCur       = pcMesh->mFaces            = new aiFace[pcMesh->mNumFaces];

        // create all vertices/faces
        BE_NCONST MDC::Triangle* pcTriangle = (BE_NCONST MDC::Triangle*)
            ((int8_t*)pcSurface+pcSurface->ulOffsetTriangles);

        BE_NCONST MDC::TexturCoord* const pcUVs = (BE_NCONST MDC::TexturCoord*)
            ((int8_t*)pcSurface+pcSurface->ulOffsetTexCoords);

        // get a pointer to the uncompressed vertices
        int16_t iOfs = *((int16_t*) ((int8_t*) pcSurface +
            pcSurface->ulOffsetFrameBaseFrames) +  this->configFrameID);

        AI_SWAP2(iOfs);

        BE_NCONST MDC::BaseVertex* const pcVerts = (BE_NCONST MDC::BaseVertex*)
            ((int8_t*)pcSurface+pcSurface->ulOffsetBaseVerts) +
            ((int)iOfs * pcSurface->ulNumVertices * 4);

        // do the main swapping stuff ...
#if (defined AI_BUILD_BIG_ENDIAN)

        // swap all triangles
        for (unsigned int i = 0; i < pcSurface->ulNumTriangles;++i)
        {
            AI_SWAP4( pcTriangle[i].aiIndices[0] );
            AI_SWAP4( pcTriangle[i].aiIndices[1] );
            AI_SWAP4( pcTriangle[i].aiIndices[2] );
        }

        // swap all vertices
        for (unsigned int i = 0; i < pcSurface->ulNumVertices*pcSurface->ulNumBaseFrames;++i)
        {
            AI_SWAP2( pcVerts->normal );
            AI_SWAP2( pcVerts->x );
            AI_SWAP2( pcVerts->y );
            AI_SWAP2( pcVerts->z );
        }

        // swap all texture coordinates
        for (unsigned int i = 0; i < pcSurface->ulNumVertices;++i)
        {
            AI_SWAP4( pcUVs->u );
            AI_SWAP4( pcUVs->v );
        }

#endif

        const MDC::CompressedVertex* pcCVerts = NULL;
        int16_t* mdcCompVert = NULL;

        // access compressed frames for large frame numbers, but never for the first
        if( this->configFrameID && pcSurface->ulNumCompFrames > 0 )
        {
            mdcCompVert = (int16_t*) ((int8_t*)pcSurface+pcSurface->ulOffsetFrameCompFrames) + this->configFrameID;
            AI_SWAP2P(mdcCompVert);
            if( *mdcCompVert >= 0 )
            {
                pcCVerts = (const MDC::CompressedVertex*)((int8_t*)pcSurface +
                    pcSurface->ulOffsetCompVerts) + *mdcCompVert * pcSurface->ulNumVertices;
            }
            else mdcCompVert = NULL;
        }

        // copy all faces
        for (unsigned int iFace = 0; iFace < pcSurface->ulNumTriangles;++iFace,
            ++pcTriangle,++pcFaceCur)
        {
            const unsigned int iOutIndex = iFace*3;
            pcFaceCur->mNumIndices = 3;
            pcFaceCur->mIndices = new unsigned int[3];

            for (unsigned int iIndex = 0; iIndex < 3;++iIndex,
                ++pcVertCur,++pcUVCur,++pcNorCur)
            {
                uint32_t quak = pcTriangle->aiIndices[iIndex];
                if (quak >= pcSurface->ulNumVertices)
                {
                    ASSIMP_LOG_ERROR("MDC vertex index is out of range");
                    quak = pcSurface->ulNumVertices-1;
                }

                // compressed vertices?
                if (mdcCompVert)
                {
                    MDC::BuildVertex(*pcFrame,pcVerts[quak],pcCVerts[quak],
                        *pcVertCur,*pcNorCur);
                }
                else
                {
                    // copy position
                    pcVertCur->x = pcVerts[quak].x * AI_MDC_BASE_SCALING;
                    pcVertCur->y = pcVerts[quak].y * AI_MDC_BASE_SCALING;
                    pcVertCur->z = pcVerts[quak].z * AI_MDC_BASE_SCALING;

                    // copy normals
                    MD3::LatLngNormalToVec3( pcVerts[quak].normal, &pcNorCur->x );

                    // copy texture coordinates
                    pcUVCur->x = pcUVs[quak].u;
                    pcUVCur->y = ai_real( 1.0 )-pcUVs[quak].v; // DX to OGL
                }
                pcVertCur->x += pcFrame->localOrigin[0] ;
                pcVertCur->y += pcFrame->localOrigin[1] ;
                pcVertCur->z += pcFrame->localOrigin[2] ;
            }

            // swap the face order - DX to OGL
            pcFaceCur->mIndices[0] = iOutIndex + 2;
            pcFaceCur->mIndices[1] = iOutIndex + 1;
            pcFaceCur->mIndices[2] = iOutIndex + 0;
        }

        pcSurface =  new ((int8_t*)pcSurface + pcSurface->ulOffsetEnd) MDC::Surface;
    }

    // create a flat node graph with a root node and one child for each surface
    if (!pScene->mNumMeshes)
        throw DeadlyImportError( "Invalid MDC file: File contains no valid mesh");
    else if (1 == pScene->mNumMeshes)
    {
        pScene->mRootNode = new aiNode();
        if ( nullptr != pScene->mMeshes[0] ) {
            pScene->mRootNode->mName = pScene->mMeshes[0]->mName;
            pScene->mRootNode->mNumMeshes = 1;
            pScene->mRootNode->mMeshes = new unsigned int[1];
            pScene->mRootNode->mMeshes[0] = 0;
        }
    }
    else
    {
        pScene->mRootNode = new aiNode();
        pScene->mRootNode->mNumChildren = pScene->mNumMeshes;
        pScene->mRootNode->mChildren = new aiNode*[pScene->mNumMeshes];
        pScene->mRootNode->mName.Set("<root>");
        for (unsigned int i = 0; i < pScene->mNumMeshes;++i)
        {
            aiNode* pcNode = pScene->mRootNode->mChildren[i] = new aiNode();
            pcNode->mParent = pScene->mRootNode;
            pcNode->mName = pScene->mMeshes[i]->mName;
            pcNode->mNumMeshes = 1;
            pcNode->mMeshes = new unsigned int[1];
            pcNode->mMeshes[0] = i;
        }
    }

    // create materials
    pScene->mNumMaterials = (unsigned int)aszShaders.size();
    pScene->mMaterials = new aiMaterial*[pScene->mNumMaterials];
    for (unsigned int i = 0; i < pScene->mNumMaterials;++i)
    {
        aiMaterial* pcMat = new aiMaterial();
        pScene->mMaterials[i] = pcMat;

        const std::string& name = aszShaders[i];

        int iMode = (int)aiShadingMode_Gouraud;
        pcMat->AddProperty<int>(&iMode, 1, AI_MATKEY_SHADING_MODEL);

        // add a small ambient color value - RtCW seems to have one
        aiColor3D clr;
        clr.b = clr.g = clr.r = 0.05f;
        pcMat->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_AMBIENT);

        if (name.length())clr.b = clr.g = clr.r = 1.0f;
        else clr.b = clr.g = clr.r = 0.6f;

        pcMat->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_DIFFUSE);
        pcMat->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_SPECULAR);

        if (name.length())
        {
            aiString path;
            path.Set(name);
            pcMat->AddProperty(&path,AI_MATKEY_TEXTURE_DIFFUSE(0));
        }
    }
}